

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall
SimpleLoggerMgr::flushStackTraceBuffer(SimpleLoggerMgr *this,RawStackInfo *stack_info)

{
  size_t sVar1;
  char *in_RSI;
  undefined8 in_RDI;
  void **unaff_retaddr;
  size_t len;
  undefined1 in_stack_00000207;
  uint64_t in_stack_00000208;
  uint32_t in_stack_00000214;
  size_t in_stack_00000218;
  SimpleLoggerMgr *in_stack_00000220;
  size_t in_stack_ffffffffffffffe8;
  int stack_size;
  
  stack_size = (int)((ulong)in_RDI >> 0x20);
  std::vector<void_*,_std::allocator<void_*>_>::operator[]
            ((vector<void_*,_std::allocator<void_*>_> *)(in_RSI + 0x10),0);
  std::vector<void_*,_std::allocator<void_*>_>::size
            ((vector<void_*,_std::allocator<void_*>_> *)(in_RSI + 0x10));
  sVar1 = _stack_interpret(unaff_retaddr,stack_size,in_RSI,in_stack_ffffffffffffffe8);
  if (sVar1 != 0) {
    _flushStackTraceBuffer
              (in_stack_00000220,in_stack_00000218,in_stack_00000214,in_stack_00000208,
               (bool)in_stack_00000207);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::flushStackTraceBuffer(RawStackInfo& stack_info) {
#if defined(__linux__) || defined(__APPLE__)
    size_t len = _stack_interpret(&stack_info.stackPtrs[0],
                                  stack_info.stackPtrs.size(),
                                  stackTraceBuffer,
                                  stackTraceBufferSize);
    if (!len) return;

    _flushStackTraceBuffer(len,
                           stack_info.tidHash,
                           stack_info.kernelTid,
                           stack_info.crashOrigin);
#endif
}